

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_errors_primitive_primitiveFailedError
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  if (argumentCount != 0) {
    sysbvm_error("Argument count mismatch");
  }
  sysbvm_error("Primitive failed");
}

Assistant:

static sysbvm_tuple_t sysbvm_errors_primitive_primitiveFailedError(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 0) sysbvm_error_argumentCountMismatch(0, argumentCount);

    sysbvm_error_primitiveFailed();
    return SYSBVM_VOID_TUPLE;
}